

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall backend::codegen::RegAllocator::add_reg_write(RegAllocator *this,Reg reg,uint point)

{
  int *piVar1;
  iterator iVar2;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>,_bool> pVar3;
  Reg local_28;
  Reg local_24;
  long local_20;
  
  local_28 = reg;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->live_intervals)._M_h,&local_28);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>.
      _M_cur == (__node_type *)0x0) {
    local_24 = local_28;
    local_20 = (ulong)point * 0x100000001;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->live_intervals);
  }
  else if (point < *(uint *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                                   ._M_cur + 0xc)) {
    *(uint *)((long)iVar2.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                    ._M_cur + 0xc) = point;
  }
  local_24 = local_28;
  local_20 = CONCAT44(local_20._4_4_,1);
  pVar3 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,int>,std::allocator<std::pair<unsigned_int_const,int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int_const,int>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,int>,std::allocator<std::pair<unsigned_int_const,int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->reg_assign_count);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    piVar1 = (int *)((long)pVar3.first.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false>.
                           _M_cur.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> +
                    0xc);
    *piVar1 = *piVar1 + 1;
  }
  add_reg_use_in_bb_at_point(this,local_28,point);
  return;
}

Assistant:

void add_reg_write(Reg reg, unsigned int point) {
    if (auto r = live_intervals.find(reg); r != live_intervals.end()) {
      r->second.add_starting_point(point);
    } else {
      live_intervals.insert({reg, Interval(point)});
    }
    auto r_use_insert = reg_assign_count.insert({reg, 1});
    if (!r_use_insert.second) {
      r_use_insert.first->second++;
    };
    add_reg_use_in_bb_at_point(reg, point);
  }